

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>::dx
          (FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_> *this,int i
          )

{
  int iVar1;
  value_type_conflict4 *pvVar2;
  FadCst<int> *in_RDI;
  value_type vVar3;
  value_type vVar4;
  value_type vVar5;
  int in_stack_ffffffffffffffcc;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *in_stack_ffffffffffffffd0;
  
  vVar3 = FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::dx
                    (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
  vVar3 = -vVar3;
  pvVar2 = FadCst<int>::val(in_RDI);
  iVar1 = *pvVar2;
  vVar4 = FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x153e140);
  vVar5 = FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>::val
                    ((FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x153e154);
  return (vVar3 * (double)iVar1) / (vVar4 * vVar5);
}

Assistant:

const value_type dx(int i) const {return  (- right_.dx(i) * left_.val() ) / (right_.val() * right_.val()) ;}